

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_open(Curl_easy *data)

{
  size_t sVar1;
  size_t byte_count;
  short local_44d;
  smb_nt_create msg;
  smb_request *req;
  Curl_easy *data_local;
  
  msg.bytes._1016_8_ = (data->req).p.file;
  sVar1 = strlen(((FILEPROTO *)msg.bytes._1016_8_)->freepath);
  if (sVar1 + 1 < 0x401) {
    memset((void *)((long)&byte_count + 5),0,0x433);
    byte_count._5_1_ = 0x18;
    byte_count._6_1_ = 0xff;
    sVar1 = strlen(*(char **)(msg.bytes._1016_8_ + 8));
    local_44d = (short)sVar1;
    msg.allocation_size._4_4_ = 7;
    if ((*(ulong *)&(data->set).field_0x8e2 >> 0x1a & 1) == 0) {
      msg.flags = 0x80000000;
      msg.ext_file_attributes = 1;
    }
    else {
      msg.flags = 0xc0000000;
      msg.ext_file_attributes = 5;
    }
    msg.create_options._1_2_ = local_44d + 1;
    strcpy((char *)((long)&msg.create_options + 3),*(char **)(msg.bytes._1016_8_ + 8));
    data_local._4_4_ = smb_send_message(data,0xa2,(void *)((long)&byte_count + 5),sVar1 + 0x34);
  }
  else {
    data_local._4_4_ = CURLE_FILESIZE_EXCEEDED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_open(struct Curl_easy *data)
{
  struct smb_request *req = data->req.p.smb;
  struct smb_nt_create msg;
  size_t byte_count;

  if((strlen(req->path) + 1) > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  memset(&msg, 0, sizeof(msg));
  msg.word_count = SMB_WC_NT_CREATE_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  byte_count = strlen(req->path);
  msg.name_length = smb_swap16((unsigned short)byte_count);
  msg.share_access = smb_swap32(SMB_FILE_SHARE_ALL);
  if(data->set.upload) {
    msg.access = smb_swap32(SMB_GENERIC_READ | SMB_GENERIC_WRITE);
    msg.create_disposition = smb_swap32(SMB_FILE_OVERWRITE_IF);
  }
  else {
    msg.access = smb_swap32(SMB_GENERIC_READ);
    msg.create_disposition = smb_swap32(SMB_FILE_OPEN);
  }
  msg.byte_count = smb_swap16((unsigned short) ++byte_count);
  strcpy(msg.bytes, req->path);

  return smb_send_message(data, SMB_COM_NT_CREATE_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}